

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

void __thiscall QRegionPrivate::intersect(QRegionPrivate *this,QRect *rect)

{
  int iVar1;
  int iVar2;
  Representation RVar3;
  bool bVar4;
  Representation RVar5;
  int iVar6;
  pointer pQVar7;
  Representation RVar8;
  QRect *nextToTop;
  QRect *prev;
  pointer r1;
  pointer bottom;
  uint uVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QRect QVar11;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar10 = (QRect)QRect::normalized();
  (this->extents).x1 = 0;
  (this->extents).y1 = 0;
  (this->extents).x2 = -1;
  (this->extents).y2 = -1;
  (this->innerRect).x1 = 0;
  (this->innerRect).y1 = 0;
  (this->innerRect).x2 = -1;
  (this->innerRect).y2 = -1;
  this->innerArea = -1;
  local_48 = QVar10;
  pQVar7 = QList<QRect>::data(&this->rects);
  uVar9 = this->numRects;
  this->numRects = 0;
  bottom = pQVar7;
  do {
    uVar9 = -uVar9;
    r1 = pQVar7;
LAB_003d198b:
    pQVar7 = r1 + 1;
    if (uVar9 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    QVar11 = qt_rect_intersect_normalized(r1,&local_48);
    *bottom = QVar11;
    RVar5 = QVar11.x1.m_i;
    if ((QVar11.x2.m_i.m_i < RVar5.m_i) || (QVar11.y2.m_i.m_i < QVar11.y1.m_i.m_i)) {
LAB_003d1a41:
      uVar9 = uVar9 + 1;
      r1 = pQVar7;
      goto LAB_003d198b;
    }
    iVar1 = this->numRects;
    if (iVar1 != 0) {
      RVar8.m_i = (this->extents).x1.m_i;
      iVar2 = (this->extents).x2.m_i;
      if (RVar5.m_i <= RVar8.m_i) {
        RVar8.m_i = RVar5.m_i;
      }
      (this->extents).x1.m_i = RVar8.m_i;
      iVar6 = (bottom->x2).m_i;
      if (iVar6 < iVar2) {
        iVar6 = iVar2;
      }
      (this->extents).x2.m_i = iVar6;
      iVar2 = (this->extents).y2.m_i;
      iVar6 = (bottom->y2).m_i;
      if (iVar6 < iVar2) {
        iVar6 = iVar2;
      }
      (this->extents).y2.m_i = iVar6;
      nextToTop = (QRect *)0x0;
      if (1 < iVar1) {
        nextToTop = bottom + -2;
      }
      bVar4 = canMergeFromBelow(bottom + -1,bottom,nextToTop,(QRect *)0x0);
      if ((!bVar4) ||
         (((uVar9 != 0xffffffff && (r1[1].y1.m_i == (bottom->y1).m_i)) &&
          ((pQVar7->x1).m_i <= QVar10.x2.m_i.m_i)))) goto LAB_003d1a55;
      bottom[-1].y2.m_i = (bottom->y2).m_i;
      updateInnerRect(this,bottom + -1);
      goto LAB_003d1a41;
    }
    RVar5.m_i = (bottom->y1).m_i;
    RVar8.m_i = (bottom->x2).m_i;
    RVar3.m_i = (bottom->y2).m_i;
    (this->extents).x1 = (Representation)(bottom->x1).m_i;
    (this->extents).y1 = (Representation)RVar5.m_i;
    (this->extents).x2 = (Representation)RVar8.m_i;
    (this->extents).y2 = (Representation)RVar3.m_i;
LAB_003d1a55:
    updateInnerRect(this,bottom);
    bottom = bottom + 1;
    this->numRects = this->numRects + 1;
    uVar9 = ~uVar9;
  } while( true );
}

Assistant:

void QRegionPrivate::intersect(const QRect &rect)
{
    Q_ASSERT(extents.intersects(rect));
    Q_ASSERT(numRects > 1);

#ifdef QT_REGION_DEBUG
    selfTest();
#endif

    const QRect r = rect.normalized();
    extents = QRect();
    innerRect = QRect();
    innerArea = -1;

    QRect *dest = rects.data();
    const QRect *src = dest;
    int n = numRects;
    numRects = 0;
    while (n--) {
        *dest = qt_rect_intersect_normalized(*src++, r);
        if (dest->isEmpty())
            continue;

        if (numRects == 0) {
            extents = *dest;
        } else {
            extents.setLeft(qMin(extents.left(), dest->left()));
            // hw: extents.top() will never change after initialization
            //extents.setTop(qMin(extents.top(), dest->top()));
            extents.setRight(qMax(extents.right(), dest->right()));
            extents.setBottom(qMax(extents.bottom(), dest->bottom()));

            const QRect *nextToLast = (numRects > 1 ? dest - 2 : nullptr);

            // mergeFromBelow inlined and optimized
            if (canMergeFromBelow(dest - 1, dest, nextToLast, nullptr)) {
                if (!n || src->y() != dest->y() || src->left() > r.right()) {
                    QRect *prev = dest - 1;
                    prev->setBottom(dest->bottom());
                    updateInnerRect(*prev);
                    continue;
                }
            }
        }
        updateInnerRect(*dest);
        ++dest;
        ++numRects;
    }
#ifdef QT_REGION_DEBUG
    selfTest();
#endif
}